

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestBrokenInclude::Run(ParserTestBrokenInclude *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  string err;
  undefined1 local_d0 [8];
  ManifestParser parser;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ParserTestBrokenInclude *local_10;
  ParserTestBrokenInclude *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"include.ninja",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"build\n",(allocator<char> *)&parser.field_0x5f);
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&parser.field_0x5f);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  ManifestParser::ManifestParser
            ((ManifestParser *)local_d0,&(this->super_ParserTest).state,
             (FileReader *)&(this->super_ParserTest).fs_,(ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_f8);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"include include.ninja\n",&local_119);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_d0,&local_118,(string *)local_f8);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3af,"parser.ParseTest(\"include include.ninja\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("include.ninja:1: expected path\nbuild\n     ^ near here",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3b3,"\"include.ninja:1: expected path\\n\" \"build\\n\" \"     ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)local_f8);
  return;
}

Assistant:

TEST_F(ParserTest, BrokenInclude) {
  fs_.Create("include.ninja", "build\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("include include.ninja\n", &err));
  EXPECT_EQ("include.ninja:1: expected path\n"
            "build\n"
            "     ^ near here"
            , err);
}